

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_math.cpp
# Opt level: O0

void ft_trig_pseudo_rotate(SW_FT_Vector *vec,SW_FT_Angle theta)

{
  long lVar1;
  long lVar2;
  long lVar3;
  SW_FT_Fixed v2;
  SW_FT_Fixed v1;
  SW_FT_Fixed *arctanptr;
  SW_FT_Fixed b;
  SW_FT_Fixed xtemp;
  SW_FT_Fixed y;
  SW_FT_Fixed x;
  SW_FT_Int i;
  SW_FT_Angle theta_local;
  SW_FT_Vector *vec_local;
  
  x = vec->x;
  y = vec->y;
  for (theta_local = theta; theta_local < -0x2d0000; theta_local = theta_local + 0x5a0000) {
    lVar3 = -x;
    x = y;
    y = lVar3;
  }
  for (; 0x2d0000 < theta_local; theta_local = theta_local + -0x5a0000) {
    lVar3 = -y;
    y = x;
    x = lVar3;
  }
  arctanptr = ft_trig_arctan_table;
  b = 1;
  for (i = 1; i < 0x17; i = i + 1) {
    lVar2 = y + b >> ((byte)i & 0x3f);
    lVar3 = x + b >> ((byte)i & 0x3f);
    if (theta_local < 0) {
      lVar3 = -lVar3;
      lVar1 = *arctanptr;
    }
    else {
      lVar2 = -lVar2;
      lVar1 = -*arctanptr;
    }
    theta_local = lVar1 + theta_local;
    x = x + lVar2;
    y = y + lVar3;
    arctanptr = arctanptr + 1;
    b = b << 1;
  }
  vec->x = x;
  vec->y = y;
  return;
}

Assistant:

static void ft_trig_pseudo_rotate(SW_FT_Vector* vec, SW_FT_Angle theta)
{
    SW_FT_Int          i;
    SW_FT_Fixed        x, y, xtemp, b;
    const SW_FT_Fixed* arctanptr;

    x = vec->x;
    y = vec->y;

    /* Rotate inside [-PI/4,PI/4] sector */
    while (theta < -SW_FT_ANGLE_PI4) {
        xtemp = y;
        y = -x;
        x = xtemp;
        theta += SW_FT_ANGLE_PI2;
    }

    while (theta > SW_FT_ANGLE_PI4) {
        xtemp = -y;
        y = x;
        x = xtemp;
        theta -= SW_FT_ANGLE_PI2;
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for (i = 1, b = 1; i < SW_FT_TRIG_MAX_ITERS; b <<= 1, i++) {
        SW_FT_Fixed v1 = ((y + b) >> i);
        SW_FT_Fixed v2 = ((x + b) >> i);
        if (theta < 0) {
            xtemp = x + v1;
            y = y - v2;
            x = xtemp;
            theta += *arctanptr++;
        } else {
            xtemp = x - v1;
            y = y + v2;
            x = xtemp;
            theta -= *arctanptr++;
        }
    }

    vec->x = x;
    vec->y = y;
}